

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void idx2::Resize<unsigned_long>(array<unsigned_long> *Array,i64 NewSize)

{
  long lVar1;
  
  if (Array->Capacity < NewSize) {
    GrowCapacity<unsigned_long>(Array,NewSize);
  }
  lVar1 = Array->Size;
  if (lVar1 < NewSize) {
    memset((Array->Buffer).Data + lVar1 * 8,0,NewSize * 8 + lVar1 * -8);
  }
  Array->Size = NewSize;
  return;
}

Assistant:

void
Resize(array<t>* Array, i64 NewSize)
{
  if (NewSize > Array->Capacity) // TODO: maybe grow the capacity until this is false
    GrowCapacity(Array, NewSize);
  if (Array->Size < NewSize)
    Fill(Begin(*Array) + Array->Size, Begin(*Array) + NewSize, t{});
  Array->Size = NewSize;
}